

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::add
          (Accumulator<OpenMD::Vector<double,_3U>_> *this,Vector<double,_3U> *val)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double *pdVar5;
  Vector<double,_3U> *in_RSI;
  long *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t i;
  ulong local_18;
  
  *in_RDI = *in_RDI + 1;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,(uint)local_18);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 1),(uint)local_18);
    *pdVar5 = dVar1;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,(uint)local_18);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 4),(uint)local_18);
    *pdVar5 = *pdVar5 + dVar1;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,(uint)local_18);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 7),(uint)local_18);
    dVar2 = *pdVar5;
    lVar3 = *in_RDI;
    auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = 0x45300000;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 7),(uint)local_18);
    *pdVar5 = *pdVar5 + (dVar1 - dVar2) /
                        ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,(uint)local_18);
    dVar1 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[](in_RSI,(uint)local_18);
    dVar2 = *pdVar5;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 10),(uint)local_18);
    dVar4 = *pdVar5;
    lVar3 = *in_RDI;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    pdVar5 = Vector<double,_3U>::operator[]((Vector<double,_3U> *)(in_RDI + 10),(uint)local_18);
    *pdVar5 = (dVar1 * dVar2 - dVar4) /
              ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) + *pdVar5;
  }
  return;
}

Assistant:

void add(const Vector<RealType, Dim>& val) {
      Count_++;

      for (std::size_t i = 0; i < Dim; i++) {
        Val_[i] = val[i];
        Total_[i] += val[i];
        Avg_[i] += (val[i] - Avg_[i]) / static_cast<RealType>(Count_);
        Avg2_[i] +=
            (val[i] * val[i] - Avg2_[i]) / static_cast<RealType>(Count_);
      }
    }